

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

NodeBase ** __thiscall
google::protobuf::internal::UntypedMapBase::CreateEmptyTable(UntypedMapBase *this,map_index_t n)

{
  char *pcVar1;
  LogMessage *pLVar2;
  NodeBase **local_80;
  NodeBase **result;
  Voidify local_51;
  uint local_50;
  uint local_4c;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_29;
  uint local_28;
  uint local_24;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  UntypedMapBase *pUStack_10;
  map_index_t n_local;
  UntypedMapBase *this_local;
  
  absl_log_internal_check_op_result._4_4_ = n;
  pUStack_10 = this;
  local_24 = absl::lts_20250127::log_internal::GetReferenceableValue(n);
  local_28 = absl::lts_20250127::log_internal::GetReferenceableValue(2);
  local_20 = absl::lts_20250127::log_internal::Check_GEImpl<unsigned_int,unsigned_int>
                       (&local_24,&local_28,"n >= kMinTableSize");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
               ,0x1cc,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&absl_log_internal_check_op_result_1);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
  }
  local_4c = absl::lts_20250127::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result._4_4_ &
                        absl_log_internal_check_op_result._4_4_ - 1);
  local_50 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_48 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                       (&local_4c,&local_50,"n & (n - 1) == 0u");
  if (local_48 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_48);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&result,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
               ,0x1cd,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&result);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&result);
  }
  if (this->arena_ == (Arena *)0x0) {
    local_80 = (NodeBase **)operator_new((ulong)absl_log_internal_check_op_result._4_4_ << 3);
  }
  else {
    local_80 = Arena::CreateArray<google::protobuf::internal::NodeBase*>
                         (this->arena_,(ulong)absl_log_internal_check_op_result._4_4_);
  }
  memset(local_80,0,(ulong)absl_log_internal_check_op_result._4_4_ << 3);
  return local_80;
}

Assistant:

NodeBase** CreateEmptyTable(map_index_t n) {
    ABSL_DCHECK_GE(n, kMinTableSize);
    ABSL_DCHECK_EQ(n & (n - 1), 0u);
    NodeBase** result =
        arena_ == nullptr
            ? static_cast<NodeBase**>(::operator new(n * sizeof(NodeBase*)))
            : Arena::CreateArray<NodeBase*>(arena_, n);
    memset(result, 0, n * sizeof(result[0]));
    return result;
  }